

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

int gdTransformAffineGetImage(gdImagePtr *dst,gdImagePtr src,gdRectPtr src_area,double *affine)

{
  int iVar1;
  gdImagePtr pgVar2;
  undefined4 local_88;
  undefined4 local_84;
  gdRect area_full;
  gdRect bbox;
  double m [6];
  int res;
  double *affine_local;
  gdRectPtr src_area_local;
  gdImagePtr src_local;
  gdImagePtr *dst_local;
  
  affine_local = (double *)src_area;
  if (src_area == (gdRectPtr)0x0) {
    local_88 = 0;
    local_84 = 0;
    area_full.x = src->sx;
    area_full.y = src->sy;
    affine_local = (double *)&local_88;
  }
  gdTransformAffineBoundingBox((gdRectPtr)affine_local,affine,(gdRectPtr)&area_full.width);
  pgVar2 = gdImageCreateTrueColor(bbox.x,bbox.y);
  *dst = pgVar2;
  if (*dst == (gdImagePtr)0x0) {
    dst_local._4_4_ = 0;
  }
  else {
    (*dst)->saveAlphaFlag = 1;
    if (src->trueColor == 0) {
      gdImagePaletteToTrueColor(src);
    }
    gdAffineTranslate((double *)&bbox.width,(double)-area_full.width,(double)-area_full.height);
    gdAffineConcat((double *)&bbox.width,affine,(double *)&bbox.width);
    gdImageAlphaBlending(*dst,0);
    iVar1 = gdTransformAffineCopy(*dst,0,0,src,(gdRectPtr)affine_local,(double *)&bbox.width);
    if (iVar1 == 1) {
      dst_local._4_4_ = 1;
    }
    else {
      gdImageDestroy(*dst);
      *dst = (gdImagePtr)0x0;
      dst_local._4_4_ = 0;
    }
  }
  return dst_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineGetImage(gdImagePtr *dst,
		  const gdImagePtr src,
		  gdRectPtr src_area,
		  const double affine[6])
{
	int res;
	double m[6];
	gdRect bbox;
	gdRect area_full;

	if (src_area == NULL) {
		area_full.x = 0;
		area_full.y = 0;
		area_full.width  = gdImageSX(src);
		area_full.height = gdImageSY(src);
		src_area = &area_full;
	}

	gdTransformAffineBoundingBox(src_area, affine, &bbox);

	*dst = gdImageCreateTrueColor(bbox.width, bbox.height);
	if (*dst == NULL) {
		return GD_FALSE;
	}
	(*dst)->saveAlphaFlag = 1;

	if (!src->trueColor) {
		gdImagePaletteToTrueColor(src);
	}
	
	/* Translate to dst origin (0,0) */
	gdAffineTranslate(m, -bbox.x, -bbox.y);
	gdAffineConcat(m, affine, m);

	gdImageAlphaBlending(*dst, 0);

	res = gdTransformAffineCopy(*dst,
		  0,0,
		  src,
		  src_area,
		  m);

	if (res != GD_TRUE) {
		gdImageDestroy(*dst);
		*dst = NULL;
		return GD_FALSE;
	} else {
		return GD_TRUE;
	}
}